

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O2

void __thiscall
libguarded::
rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::
push_back(rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
          *this,SignalBase *data)

{
  atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*>
  aVar1;
  _Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
  _Var2;
  SignalBase **in_RCX;
  unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  newNode;
  unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  local_20;
  SignalBase *local_10;
  
  local_10 = data;
  detail::
  allocate_unique<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node,std::allocator<libguarded::rcu_list<CsSignal::SignalBase_const*,std::mutex,std::allocator<CsSignal::SignalBase_const*>>::node>,CsSignal::SignalBase_const*>
            (&local_20,(detail *)&this->field_0x40,
             (allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>
              *)&local_10,in_RCX);
  _Var2._M_head_impl =
       local_20._M_t.
       super___uniq_ptr_impl<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
       .
       super__Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
       ._M_head_impl;
  aVar1._M_b._M_p = (__base_type)(this->m_tail)._M_b._M_p;
  if (aVar1._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    (this->m_head)._M_b._M_p =
         local_20._M_t.
         super___uniq_ptr_impl<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
         .
         super__Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
         ._M_head_impl;
    UNLOCK();
  }
  else {
    LOCK();
    ((local_20._M_t.
      super___uniq_ptr_impl<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
      .
      super__Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
     ._M_head_impl)->back)._M_b = aVar1._M_b._M_p;
    UNLOCK();
    LOCK();
    *(node **)aVar1._M_b._M_p =
         local_20._M_t.
         super___uniq_ptr_impl<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
         .
         super__Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
         ._M_head_impl;
    UNLOCK();
  }
  local_20._M_t.
  super___uniq_ptr_impl<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  .
  super__Head_base<0UL,_libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node_*,_false>
  ._M_head_impl = (node *)0x0;
  LOCK();
  (this->m_tail)._M_b._M_p = _Var2._M_head_impl;
  UNLOCK();
  std::
  unique_ptr<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::node>_>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::push_back(T data)
{
   auto newNode = detail::allocate_unique<node>(m_node_alloc, std::move(data));

   node *oldTail = m_tail.load(std::memory_order_relaxed);

   if (oldTail == nullptr) {
      m_head.store(newNode.get());
      m_tail.store(newNode.release());
   } else {
      newNode->back.store(oldTail);
      oldTail->next.store(newNode.get());
      m_tail.store(newNode.release());
   }
}